

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::finalize_tokens
          (Tokenizer *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *features)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  const_reference pvVar5;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RSI;
  long in_RDI;
  string final_token;
  bool attach;
  string *suffix;
  string *prefix;
  size_t j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *token_features;
  Casing casing;
  string *str;
  value_type *token;
  size_t i_1;
  vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> case_markups;
  size_t i;
  size_t num_features;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  CaseMarkupType in_stack_fffffffffffffcec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd40;
  undefined1 soft;
  string *in_stack_fffffffffffffd48;
  byte local_28a;
  byte local_289;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [38];
  byte local_18a;
  allocator<char> local_189;
  string local_188 [38];
  byte local_162;
  allocator<char> local_161;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [39];
  byte local_d9;
  string *local_d8;
  string *local_d0;
  string local_c8 [32];
  ulong local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  Casing local_94;
  const_reference local_90;
  const_reference local_88;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong local_30;
  size_type local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  local_28 = 0;
  sVar2 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_10);
  if (sVar2 != 0) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[](local_10,0);
    bVar1 = Token::has_features((Token *)0x3c3d4c);
    if (bVar1) {
      pvVar5 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[](local_10,0);
      local_28 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&pvVar5->features);
    }
  }
  if ((*(byte *)(in_RDI + 0x31) & 1) != 0) {
    local_28 = local_28 + 1;
  }
  for (local_30 = 0; soft = (undefined1)((ulong)in_stack_fffffffffffffd40 >> 0x38),
      local_30 < local_28; local_30 = local_30 + 1) {
    local_50.field_2._12_4_ = 0;
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::emplace_back<int>((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffcf0,
                        (int *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)in_stack_fffffffffffffce0);
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  }
  std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::vector
            ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)0x3c3e2c);
  if ((*(byte *)(in_RDI + 0x32) & 1) != 0) {
    get_case_markups((vector<onmt::Token,_std::allocator<onmt::Token>_> *)in_stack_fffffffffffffd48,
                     (bool)soft);
    std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::operator=
              ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
               in_stack_fffffffffffffcf0,
               (vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::~vector
              ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
               in_stack_fffffffffffffcf0);
  }
  for (local_80 = 0; uVar4 = local_80,
      sVar2 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_10), uVar4 < sVar2;
      local_80 = local_80 + 1) {
    local_90 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[](local_10,local_80)
    ;
    local_94 = local_90->casing;
    local_88 = local_90;
    bVar1 = Token::has_features((Token *)0x3c3f26);
    if (bVar1) {
      local_a0 = &local_88->features;
      for (local_a8 = 0; uVar4 = local_a8,
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_a0), uVar4 < sVar2; local_a8 = local_a8 + 1) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_20,local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_a0,local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcf0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
    }
    if (((*(byte *)(in_RDI + 0x32) & 1) != 0) &&
       (pvVar3 = std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::
                 operator[]((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *
                            )&local_50,local_80), pvVar3->prefix != None)) {
      std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::operator[]
                ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)&local_50,
                 local_80);
      std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::operator[]
                ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)&local_50,
                 local_80);
      write_case_markup_abi_cxx11_
                ((CaseMarkupType)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                 (Casing)in_stack_fffffffffffffd48);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      std::__cxx11::string::~string(local_c8);
    }
    local_d0 = (string *)0x0;
    local_d8 = (string *)0x0;
    local_d9 = (local_88->preserve ^ 0xffU) & 1;
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
        if (((local_80 == 0) && ((local_88->spacer & 1U) != 0)) ||
           ((local_80 != 0 &&
            (((local_88->join_left & 1U) == 0 &&
             (pvVar5 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::operator[]
                                 (local_10,local_80 - 1), (pvVar5->join_right & 1U) == 0)))))) {
          local_d0 = (string *)spacer_marker_abi_cxx11_;
        }
        local_28a = 0;
        if ((local_d9 & 1) != 0) {
          local_28a = *(byte *)(in_RDI + 0x59) ^ 0xff;
        }
        local_d9 = local_28a & 1;
      }
    }
    else {
      if (((local_88->join_left & 1U) != 0) && (local_80 != 0)) {
        local_d0 = (string *)(in_RDI + 0x38);
      }
      if (((local_88->join_right & 1U) != 0) &&
         (uVar4 = local_80 + 1,
         sVar2 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_10),
         uVar4 < sVar2)) {
        local_d8 = (string *)(in_RDI + 0x38);
      }
      if ((local_88->spacer & 1U) != 0) {
        local_d9 = 1;
      }
      local_289 = 0;
      if ((local_d9 & 1) != 0) {
        local_289 = *(byte *)(in_RDI + 0x37) ^ 0xff;
      }
      local_d9 = local_289 & 1;
    }
    if ((local_d0 == (string *)0x0) && (local_d8 == (string *)0x0)) {
      std::__cxx11::string::string(local_100,(string *)local_90);
      add_final_token((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd10,
                      (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                      in_stack_fffffffffffffcf8,(Casing)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      std::__cxx11::string::~string(local_100);
    }
    else if (local_d9 == 0) {
      if (local_d0 != (string *)0x0) {
        in_stack_fffffffffffffd20 = local_18;
        std::__cxx11::string::string(local_1d0,local_d0);
        add_final_token((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd10,
                        (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                        in_stack_fffffffffffffcf8,(Casing)((ulong)in_stack_fffffffffffffcf0 >> 0x20)
                       );
        std::__cxx11::string::~string(local_1d0);
      }
      in_stack_fffffffffffffd1f = *(undefined1 *)(in_RDI + 0x31);
      in_stack_fffffffffffffd08 = local_18;
      in_stack_fffffffffffffd10 = local_20;
      std::__cxx11::string::string(local_1f0,(string *)local_90);
      add_final_token((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd10,
                      (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                      in_stack_fffffffffffffcf8,(Casing)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      std::__cxx11::string::~string(local_1f0);
      if (local_d8 != (string *)0x0) {
        in_stack_fffffffffffffd07 = *(undefined1 *)(in_RDI + 0x31);
        in_stack_fffffffffffffcf0 = local_18;
        in_stack_fffffffffffffcf8 = local_20;
        std::__cxx11::string::string(local_210,local_d8);
        add_final_token((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd10,
                        (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                        in_stack_fffffffffffffcf8,(Casing)((ulong)in_stack_fffffffffffffcf0 >> 0x20)
                       );
        std::__cxx11::string::~string(local_210);
      }
    }
    else {
      local_162 = 0;
      if (local_d0 == (string *)0x0) {
        std::allocator<char>::allocator();
        local_162 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd20,
                   (char *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                   (allocator<char> *)in_stack_fffffffffffffd10);
      }
      else {
        std::__cxx11::string::string(local_160,local_d0);
      }
      std::operator+(in_stack_fffffffffffffd08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
      local_18a = 0;
      if (local_d8 == (string *)0x0) {
        std::allocator<char>::allocator();
        local_18a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd20,
                   (char *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                   (allocator<char> *)in_stack_fffffffffffffd10);
      }
      else {
        std::__cxx11::string::string(local_188,local_d8);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                     in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_188);
      if ((local_18a & 1) != 0) {
        std::allocator<char>::~allocator(&local_189);
      }
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      if ((local_162 & 1) != 0) {
        std::allocator<char>::~allocator(&local_161);
      }
      in_stack_fffffffffffffd48 = local_1b0;
      std::__cxx11::string::string(in_stack_fffffffffffffd48,local_120);
      add_final_token((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd10,
                      (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                      in_stack_fffffffffffffcf8,(Casing)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string(local_120);
    }
    if (((*(byte *)(in_RDI + 0x32) & 1) != 0) &&
       (pvVar3 = std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::
                 operator[]((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *
                            )&local_50,local_80), pvVar3->suffix != None)) {
      in_stack_fffffffffffffce0 = &local_50;
      pvVar3 = std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::
               operator[]((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
                          in_stack_fffffffffffffce0,local_80);
      in_stack_fffffffffffffcec = pvVar3->suffix;
      std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::operator[]
                ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
                 in_stack_fffffffffffffce0,local_80);
      write_case_markup_abi_cxx11_
                ((CaseMarkupType)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                 (Casing)in_stack_fffffffffffffd48);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      std::__cxx11::string::~string(local_230);
    }
  }
  std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::~vector
            ((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
             in_stack_fffffffffffffcf0);
  return;
}

Assistant:

void Tokenizer::finalize_tokens(const std::vector<Token>& annotated_tokens,
                                  std::vector<std::string>& tokens,
                                  std::vector<std::vector<std::string>>& features) const
  {
    tokens.reserve(annotated_tokens.size());
    size_t num_features = 0;
    if (annotated_tokens.size() > 0 && annotated_tokens[0].has_features())
      num_features = annotated_tokens[0].features.size();
    if (_options.case_feature)
      num_features += 1;

    for (size_t i = 0; i < num_features; ++i)
    {
      features.emplace_back(0);
      features.back().reserve(annotated_tokens.size());
    }

    std::vector<TokenCaseMarkup> case_markups;
    if (_options.case_markup)
      case_markups = get_case_markups(annotated_tokens, _options.soft_case_regions);

    for (size_t i = 0; i < annotated_tokens.size(); ++i)
    {
      const auto& token = annotated_tokens[i];
      const auto& str = token.surface;
      const auto casing = token.casing;

      if (token.has_features())
      {
        const auto& token_features = token.features;
        for (size_t j = 0; j < token_features.size(); ++j)
          features[j].push_back(token_features[j]);
      }

      if (_options.case_markup && case_markups[i].prefix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].prefix, case_markups[i].casing));

      const std::string* prefix = nullptr;
      const std::string* suffix = nullptr;
      bool attach = !token.preserve;

      if (_options.joiner_annotate)
      {
        if (token.join_left && i > 0)
          prefix = &_options.joiner;
        if (token.join_right && i + 1 < annotated_tokens.size())
          suffix = &_options.joiner;
        if (token.spacer)
          attach = true;  // Ignore preserve flag for spacers in joiner mode.
        attach = attach && !_options.joiner_new;
      }
      else if (_options.spacer_annotate)
      {
        if ((i == 0 && token.spacer)
            || (i > 0 && !token.join_left && !annotated_tokens[i - 1].join_right))
          prefix = &spacer_marker;
        attach = attach && !_options.spacer_new;
      }

      if (!prefix && !suffix)
        add_final_token(tokens, features, _options.case_feature, str, casing);
      else if (attach)
      {
        std::string final_token = (prefix ? *prefix : "") + str + (suffix ? *suffix : "");
        add_final_token(tokens, features, _options.case_feature, std::move(final_token), casing);
      }
      else
      {
        if (prefix)
          add_final_token(tokens, features, _options.case_feature, *prefix);
        add_final_token(tokens, features, _options.case_feature, str, casing);
        if (suffix)
          add_final_token(tokens, features, _options.case_feature, *suffix);
      }

      if (_options.case_markup && case_markups[i].suffix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].suffix, case_markups[i].casing));
    }
  }